

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  LG *l;
  global_State *g;
  lua_State *L;
  int i;
  void *ud_local;
  lua_Alloc f_local;
  
  g = (global_State *)(*f)(ud,(void *)0x0,8,0x2c0);
  if (g == (global_State *)0x0) {
    f_local = (lua_Alloc)0x0;
  }
  else {
    g->frealloc = (lua_Alloc)0x0;
    *(lu_byte *)&g->ud = '\b';
    *(undefined1 *)((long)g->tmname + 4) = 0x21;
    *(byte *)((long)&g->ud + 1) = *(byte *)((long)g->tmname + 4) & 3;
    *(undefined1 *)((long)g->tmname + 6) = 0;
    preinit_state((lua_State *)g,(global_State *)((anon_union_32_2_9473004a_for_u *)&g->uvhead + 1))
    ;
    ((global_State *)((anon_union_32_2_9473004a_for_u *)&g->uvhead + 1))->frealloc = f;
    (g->buff).buffer = (char *)ud;
    g->mt[6] = (Table *)g;
    uVar1 = makeseed((lua_State *)g);
    *(uint *)g->tmname = uVar1;
    g->tmname[0xf] = (TString *)(g->tmname + 0xc);
    g->tmname[0x10] = (TString *)(g->tmname + 0xc);
    *(undefined1 *)((long)g->tmname + 7) = 0;
    *(undefined8 *)&g->gcstepmul = 0;
    *(undefined4 *)((long)&g->mainthread + 4) = 0;
    *(undefined4 *)&g->mainthread = 0;
    g->panic = (lua_CFunction)0x0;
    *(undefined4 *)&g->memerrmsg = 0;
    g->mt[0] = (Table *)0x0;
    g->mt[2] = (Table *)0x0;
    g->mt[5] = (Table *)0x0;
    g->mt[7] = (Table *)0x0;
    *(undefined1 *)((long)g->tmname + 5) = 5;
    g->tmname[2] = (TString *)0x0;
    g->tmname[3] = (TString *)0x0;
    g->tmname[0xb] = (TString *)0x0;
    g->tmname[5] = (TString *)0x0;
    g->tmname[4] = (TString *)0x0;
    g->tmname[7] = (TString *)0x0;
    g->tmname[6] = (TString *)0x0;
    g->tmname[10] = (TString *)0x0;
    g->tmname[9] = (TString *)0x0;
    g->tmname[8] = (TString *)0x0;
    (g->buff).n = 0x2c0;
    (g->buff).buffsize = 0;
    *(undefined4 *)(g->mt + 3) = 200;
    *(undefined4 *)((long)g->mt + 0x1c) = 200;
    *(undefined4 *)(g->mt + 4) = 200;
    for (L._4_4_ = 0; L._4_4_ < 9; L._4_4_ = L._4_4_ + 1) {
      (&g[1].grayagain)[L._4_4_] = (GCObject *)0x0;
    }
    iVar2 = luaD_rawrunprotected((lua_State *)g,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state((lua_State *)g);
      g = (global_State *)0x0;
    }
    f_local = (lua_Alloc)g;
  }
  return (lua_State *)f_local;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bit2mask(WHITE0BIT, FIXEDBIT);
  L->marked = luaC_white(g);
  g->gckind = KGC_NORMAL;
  preinit_state(L, g);
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->seed = makeseed(L);
  g->uvhead.u.l.prev = &g->uvhead;
  g->uvhead.u.l.next = &g->uvhead;
  g->gcrunning = 0;  /* no GC while building state */
  g->GCestimate = 0;
  g->strt.size = 0;
  g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  luaZ_initbuffer(L, &g->buff);
  g->panic = NULL;
  g->version = NULL;
  g->gcstate = GCSpause;
  g->allgc = NULL;
  g->finobj = NULL;
  g->tobefnz = NULL;
  g->sweepgc = g->sweepfin = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->gcpause = LUAI_GCPAUSE;
  g->gcmajorinc = LUAI_GCMAJOR;
  g->gcstepmul = LUAI_GCMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}